

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O3

string * __thiscall
OSTEI_HRR_Writer::HRRKetStepVar_
          (string *__return_storage_ptr__,OSTEI_HRR_Writer *this,Doublet *d,string *brastr)

{
  int iVar1;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  int local_ac;
  string local_a8;
  string arrname;
  undefined1 local_68 [32];
  _Alloc_hider local_48;
  char local_38 [16];
  
  local_68._0_4_ = d->type;
  local_68._4_4_ = (d->left).ijk._M_elems[0];
  local_68._8_4_ = (d->left).ijk._M_elems[1];
  local_68._12_4_ = (d->left).ijk._M_elems[2];
  local_68._16_4_ = (d->right).ijk._M_elems[0];
  local_68._20_4_ = (d->right).ijk._M_elems[1];
  local_68._24_4_ = (d->right).ijk._M_elems[2];
  pcVar2 = (d->tag)._M_dataplus._M_p;
  local_48._M_p = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + (d->tag)._M_string_length);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  ArrVarName(&arrname,brastr,(Doublet *)local_68,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  iVar6 = (d->left).ijk._M_elems[2];
  iVar3 = (d->left).ijk._M_elems[1] + (d->left).ijk._M_elems[0];
  iVar4 = (d->right).ijk._M_elems[1] + (d->right).ijk._M_elems[0];
  iVar1 = (d->right).ijk._M_elems[2];
  uVar7 = iVar1 + iVar4 + 1;
  iVar6 = ((int)((iVar4 + iVar1 + 2) * uVar7) / 2) *
          (((iVar3 + iVar6 + 2) * (iVar6 + iVar3 + 1)) / 2);
  local_a8._M_dataplus._M_p._0_4_ = iVar6;
  pcVar5 = Doublet::index(d,(char *)(ulong)uVar7,iVar6);
  local_ac = (int)pcVar5;
  StringBuilder<char[5],std::__cxx11::string&,char_const(&)[9],int,char_const(&)[4],int,char_const(&)[2]>
            (__return_storage_ptr__,(char (*) [5])0x1492dc,&arrname,(char (*) [9])"[ibra * ",
             (int *)&local_a8,(char (*) [4])0x14c029,&local_ac,(char (*) [2])0x14b12c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arrname._M_dataplus._M_p != &arrname.field_2) {
    operator_delete(arrname._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OSTEI_HRR_Writer::HRRKetStepVar_(const Doublet & d, const std::string & brastr) const
{
    std::string arrname = ArrVarName(brastr, d);
    return StringBuilder("HRR_", arrname, "[ibra * ", d.ncart(), " + ", d.index(), "]"); 
}